

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_decimal_result<char_*>
fmt::v10::detail::format_decimal<char,unsigned_long>(char *out,unsigned_long value,int size)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  format_decimal_result<char_*> fVar6;
  
  lVar2 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  if (size < (int)((uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar2] -
                  (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                           (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10
                                                        [lVar2] * 8)))) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format.h"
                ,0x51e,"invalid digit count");
  }
  pcVar4 = out + size;
  pcVar3 = pcVar4;
  uVar5 = value;
  if (99 < value) {
    do {
      value = uVar5 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar5 % 100) * 2);
      pcVar3 = pcVar3 + -2;
      bVar1 = 9999 < uVar5;
      uVar5 = value;
    } while (bVar1);
  }
  if (value < 10) {
    pcVar3[-1] = (byte)value | 0x30;
    pcVar3 = pcVar3 + -1;
  }
  else {
    *(undefined2 *)(pcVar3 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + value * 2);
    pcVar3 = pcVar3 + -2;
  }
  fVar6.end = pcVar4;
  fVar6.begin = pcVar3;
  return fVar6;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}